

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

bool __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::Generate
          (AnnotatedBinaryTextGenerator *this,string *filename,string *schema_filename,
          string *output_filename)

{
  long lVar1;
  _Base_ptr p_Var2;
  BinarySection *section;
  BinaryRegion *pBVar3;
  string *psVar4;
  string *filepath;
  ostream *poVar5;
  _Base_ptr p_Var6;
  BinaryRegion *extraout_RDX;
  ulong uVar7;
  AnnotatedBinaryTextGenerator *pAVar8;
  ulong uVar9;
  OutputConfig *in_R8;
  _Base_ptr this_00;
  BinaryRegion *region;
  BinaryRegion *region_00;
  undefined1 auVar10 [16];
  long lStack_2f0;
  string sStack_2e8;
  AnnotatedBinaryTextGenerator *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  _Base_ptr local_2a0;
  string *local_298;
  string *local_290;
  string *local_288;
  _Rb_tree_node_base *local_280;
  ulong local_278;
  ulong local_270;
  size_t local_268;
  long local_260;
  undefined1 local_258;
  char local_257;
  string out;
  ofstream ofs;
  ulong local_228;
  
  local_270 = 0x14;
  local_258 = 0x7c;
  local_268 = (this->options_).max_bytes_per_line;
  local_257 = (this->options_).include_vector_contents;
  lVar1 = this->binary_length_;
  if (lVar1 < 0x1000000) {
    if (lVar1 < 0x10000) {
      lStack_2f0 = (ulong)(0xff < lVar1) * 2 + 2;
    }
    else {
      lStack_2f0 = 6;
    }
  }
  else {
    lStack_2f0 = 8;
  }
  local_278 = 0;
  local_2a0 = &(this->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar7 = 0x14;
  uVar9 = 0;
  p_Var6 = (this->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2c8 = this;
  local_298 = output_filename;
  local_290 = schema_filename;
  local_288 = filename;
  local_260 = lStack_2f0;
  while (p_Var6 != local_2a0) {
    p_Var2 = p_Var6[2]._M_right;
    local_280 = p_Var6;
    for (this_00 = p_Var6[2]._M_left; this_00 != p_Var2; this_00 = this_00 + 5) {
      (anonymous_namespace)::GenerateTypeString_abi_cxx11_
                ((string *)&ofs,(_anonymous_namespace_ *)this_00,(BinaryRegion *)schema_filename);
      if (uVar9 < local_228) {
        uVar9 = local_228;
      }
      local_278 = uVar9;
      if (this_00->_M_right == (_Base_ptr)0x0) {
        (anonymous_namespace)::ToValueString_abi_cxx11_
                  (&sStack_2e8,(_anonymous_namespace_ *)this_00,(BinaryRegion *)local_2c8->binary_,
                   (uint8_t *)&local_278,in_R8);
        std::__cxx11::string::operator=((string *)&ofs,(string *)&sStack_2e8);
        std::__cxx11::string::~string((string *)&sStack_2e8);
        local_270 = uVar7;
        if (uVar7 < local_228) {
          uVar7 = local_228;
          local_270 = local_228;
        }
      }
      std::__cxx11::string::~string((string *)&ofs);
      schema_filename = (string *)extraout_RDX;
    }
    auVar10 = std::_Rb_tree_increment(local_280);
    schema_filename = auVar10._8_8_;
    p_Var6 = auVar10._0_8_;
  }
  std::__cxx11::string::string((string *)&out,(string *)local_298);
  filepath = local_288;
  psVar4 = local_290;
  pAVar8 = local_2c8;
  if (out._M_string_length == 0) {
    StripExtension((string *)&ofs,local_288);
    std::__cxx11::string::operator=((string *)&out,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::append((string *)&out);
    if ((pAVar8->options_).output_extension._M_string_length == 0) {
      GetExtension(&sStack_2e8,filepath);
    }
    else {
      std::__cxx11::string::string
                ((string *)&sStack_2e8,(string *)&(pAVar8->options_).output_extension);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,".",
                   &sStack_2e8);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&sStack_2e8);
  }
  std::ofstream::ofstream(&ofs,out._M_dataplus._M_p,_S_out);
  poVar5 = std::operator<<((ostream *)&ofs,"// Annotated Flatbuffer Binary");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&ofs,"//");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (psVar4->_M_string_length != 0) {
    poVar5 = std::operator<<((ostream *)&ofs,"// Schema file: ");
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<((ostream *)&ofs,"// Binary file: ");
  poVar5 = std::operator<<(poVar5,(string *)filepath);
  std::endl<char,std::char_traits<char>>(poVar5);
  p_Var6 = (pAVar8->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var6 != local_2a0) {
    section = (BinarySection *)pAVar8->binary_;
    std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    switch(*(undefined4 *)&p_Var6[2]._M_parent) {
    case 0:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"unknown",(allocator<char> *)&local_2c0);
      break;
    case 1:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"header",(allocator<char> *)&local_2c0);
      break;
    case 2:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"table",(allocator<char> *)&local_2c0);
      break;
    case 3:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"root_table",(allocator<char> *)&local_2c0);
      break;
    case 4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"vtable",(allocator<char> *)&local_2c0);
      break;
    case 5:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"struct",(allocator<char> *)&local_2c0);
      break;
    case 6:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"string",(allocator<char> *)&local_2c0);
      break;
    case 7:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"vector",(allocator<char> *)&local_2c0);
      break;
    case 8:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"union",(allocator<char> *)&local_2c0);
      break;
    case 9:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"padding",(allocator<char> *)&local_2c0);
      break;
    case 10:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"vector64",(allocator<char> *)&local_2c0);
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"todo",(allocator<char> *)&local_2c0);
    }
    std::operator<<((ostream *)&ofs,(string *)&sStack_2e8);
    std::__cxx11::string::~string((string *)&sStack_2e8);
    if (p_Var6[1]._M_left != (_Base_ptr)0x0) {
      std::operator+(&local_2c0," (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var6[1]._M_parent);
      std::operator+(&sStack_2e8,&local_2c0,")");
      std::operator<<((ostream *)&ofs,(string *)&sStack_2e8);
      std::__cxx11::string::~string((string *)&sStack_2e8);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    std::operator<<((ostream *)&ofs,":");
    if ((((*(int *)&p_Var6[2]._M_parent == 10) || (*(int *)&p_Var6[2]._M_parent == 7)) &&
        (local_257 == '\0')) &&
       (4 < (ulong)(((long)p_Var6[2]._M_right - (long)p_Var6[2]._M_left) / 0xa0))) {
      anon_unknown_7::GenerateRegion
                ((ostream *)&ofs,(BinaryRegion *)p_Var6[2]._M_left,section,(uint8_t *)&local_278,
                 in_R8);
      anon_unknown_7::GenerateRegion
                ((ostream *)&ofs,(BinaryRegion *)(p_Var6[2]._M_left + 5),section,
                 (uint8_t *)&local_278,in_R8);
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&ofs);
      poVar5 = std::operator<<(poVar5,"  <");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," regions omitted>");
      anon_unknown_7::GenerateRegion
                ((ostream *)&ofs,(BinaryRegion *)(p_Var6[2]._M_right + -5),section,
                 (uint8_t *)&local_278,in_R8);
    }
    else {
      pBVar3 = (BinaryRegion *)p_Var6[2]._M_right;
      for (region_00 = (BinaryRegion *)p_Var6[2]._M_left; region_00 != pBVar3;
          region_00 = region_00 + 1) {
        anon_unknown_7::GenerateRegion
                  ((ostream *)&ofs,region_00,section,(uint8_t *)&local_278,in_R8);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    pAVar8 = local_2c8;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&out);
  return true;
}

Assistant:

bool AnnotatedBinaryTextGenerator::Generate(
    const std::string &filename, const std::string &schema_filename,
    const std::string &output_filename) {
  OutputConfig output_config;
  output_config.max_bytes_per_line = options_.max_bytes_per_line;
  output_config.include_vector_contents = options_.include_vector_contents;

  // Given the length of the binary, we can calculate the maximum number of
  // characters to display in the offset hex: (i.e. 2 would lead to 0XFF being
  // the max output).
  output_config.offset_max_char =
      binary_length_ > 0xFFFFFF
          ? 8
          : (binary_length_ > 0xFFFF ? 6 : (binary_length_ > 0xFF ? 4 : 2));

  // Find the largest type string of all the regions in this file, so we can
  // align the output nicely.
  output_config.largest_type_string = 0;
  for (const auto &section : annotations_) {
    for (const auto &region : section.second.regions) {
      std::string s = GenerateTypeString(region);
      if (s.size() > output_config.largest_type_string) {
        output_config.largest_type_string = s.size();
      }

      // Don't consider array regions, as they will be split to multiple lines.
      if (!region.array_length) {
        s = ToValueString(region, binary_, output_config);
        if (s.size() > output_config.largest_value_string) {
          output_config.largest_value_string = s.size();
        }
      }
    }
  }

  std::string out = output_filename;
  if (out.empty()) {
    // Modify the output filename.
    out = StripExtension(filename);
    out += options_.output_postfix;
    out +=
        "." + (options_.output_extension.empty() ? GetExtension(filename)
                                                 : options_.output_extension);
  }

  std::ofstream ofs(out.c_str());

  ofs << "// Annotated Flatbuffer Binary" << std::endl;
  ofs << "//" << std::endl;
  if (!schema_filename.empty()) {
    ofs << "// Schema file: " << schema_filename << std::endl;
  }
  ofs << "// Binary file: " << filename << std::endl;

  // Generate each of the binary sections
  for (const auto &section : annotations_) {
    GenerateSection(ofs, section.second, binary_, output_config);
  }

  ofs.close();
  return true;
}